

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8_t *target)

{
  int iVar1;
  undefined4 extraout_var;
  uint8_t *puVar2;
  
  iVar1 = (*this->_vptr_MessageLite[4])();
  puVar2 = SerializeToArrayImpl
                     (this,target,
                      *(int *)((long)&this->_vptr_MessageLite +
                              (ulong)*(uint *)(CONCAT44(extraout_var,iVar1) + 0x38)));
  return puVar2;
}

Assistant:

uint8_t* MessageLite::SerializeWithCachedSizesToArray(uint8_t* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}